

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_d9a9a::Number<wchar_t>::Number(Number<wchar_t> *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Number_001d6e58;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&this->out_);
  this->base_ = pstore::dump::number_base::default_base_;
  return;
}

Assistant:

Number ()
                : base_{pstore::dump::number_base::default_base ()} {}